

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,uint32 field_number,_func_bool_int *is_valid,
               UnknownFieldSet *unknown_fields,RepeatedField<int> *values)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  int64 iVar5;
  ulong uVar6;
  uint first_byte_or_zero;
  int iVar7;
  uint32 first_byte_or_zero_00;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    first_byte_or_zero = (uint)*pbVar2;
    if (-1 < (char)*pbVar2) {
      input->buffer_ = pbVar2 + 1;
      goto LAB_005ca570;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  first_byte_or_zero = (uint)iVar5;
  if (iVar5 < 0) {
    return false;
  }
LAB_005ca570:
  limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero);
  do {
    iVar4 = io::CodedInputStream::BytesUntilLimit(input);
    if (iVar4 < 1) {
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (ulong)bVar1;
      first_byte_or_zero_00 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_005ca5a5;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero_00 = 0;
LAB_005ca5a5:
      uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero_00);
      if ((long)uVar6 < 0) {
        return false;
      }
    }
    iVar4 = (int)uVar6;
    if ((is_valid == (_func_bool_int *)0x0) || (bVar3 = (*is_valid)(iVar4), bVar3)) {
      iVar7 = values->current_size_;
      if (iVar7 == values->total_size_) {
        RepeatedField<int>::Reserve(values,iVar7 + 1);
        iVar7 = values->current_size_;
      }
      values->current_size_ = iVar7 + 1;
      values->rep_->elements[iVar7] = iVar4;
    }
    else {
      UnknownFieldSet::AddVarint(unknown_fields,field_number,(long)iVar4);
    }
  } while( true );
}

Assistant:

bool WireFormat::ReadPackedEnumPreserveUnknowns(io::CodedInputStream* input,
                                                uint32 field_number,
                                                bool (*is_valid)(int),
                                                UnknownFieldSet* unknown_fields,
                                                RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      unknown_fields->AddVarint(field_number, value);
    }
  }
  input->PopLimit(limit);
  return true;
}